

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint32_t helper_float_ceil_w_d_mips64(CPUMIPSState_conflict5 *env,uint64_t fdt0)

{
  uint uVar1;
  uintptr_t unaff_retaddr;
  uint32_t local_1c;
  uint32_t wt2;
  uint64_t fdt0_local;
  CPUMIPSState_conflict5 *env_local;
  
  set_float_rounding_mode(2,&(env->active_fpu).fp_status);
  local_1c = float64_to_int32_mips64(fdt0,&(env->active_fpu).fp_status);
  restore_rounding_mode(env);
  uVar1 = get_float_exception_flags(&(env->active_fpu).fp_status);
  if ((uVar1 & 9) != 0) {
    local_1c = 0x7fffffff;
  }
  update_fcr31(env,unaff_retaddr);
  return local_1c;
}

Assistant:

uint32_t helper_float_ceil_w_d(CPUMIPSState *env, uint64_t fdt0)
{
    uint32_t wt2;

    set_float_rounding_mode(float_round_up, &env->active_fpu.fp_status);
    wt2 = float64_to_int32(fdt0, &env->active_fpu.fp_status);
    restore_rounding_mode(env);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
        & (float_flag_invalid | float_flag_overflow)) {
        wt2 = FP_TO_INT32_OVERFLOW;
    }
    update_fcr31(env, GETPC());
    return wt2;
}